

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::image::anon_unknown_0::MemoryQualifierTestCase::createInstance
          (MemoryQualifierTestCase *this,Context *context)

{
  Context *context_local;
  MemoryQualifierTestCase *this_local;
  
  if (this->m_imageType == IMAGE_TYPE_BUFFER) {
    this_local = (MemoryQualifierTestCase *)operator_new(0xd8);
    MemoryQualifierInstanceBuffer::MemoryQualifierInstanceBuffer
              ((MemoryQualifierInstanceBuffer *)this_local,context,
               &(this->super_TestCase).super_TestCase.super_TestNode.m_name,this->m_imageType,
               &this->m_imageSize,&this->m_format);
  }
  else {
    this_local = (MemoryQualifierTestCase *)operator_new(0xe8);
    MemoryQualifierInstanceImage::MemoryQualifierInstanceImage
              ((MemoryQualifierInstanceImage *)this_local,context,
               &(this->super_TestCase).super_TestCase.super_TestNode.m_name,this->m_imageType,
               &this->m_imageSize,&this->m_format);
  }
  return (TestInstance *)this_local;
}

Assistant:

TestInstance* MemoryQualifierTestCase::createInstance (Context& context) const
{
	if ( m_imageType == IMAGE_TYPE_BUFFER )
		return new MemoryQualifierInstanceBuffer(context, m_name, m_imageType, m_imageSize, m_format);
	else
		return new MemoryQualifierInstanceImage(context, m_name, m_imageType, m_imageSize, m_format);
}